

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void check_initializer(c2m_ctx_t c2m_ctx,decl_t member_decl,type **type_ptr,
                      node_t_conflict initializer,int const_only_p,int top_p)

{
  ulong uVar1;
  undefined8 *puVar2;
  init_object_t obj;
  init_object_t obj_00;
  decl_t pdVar3;
  int iVar4;
  node_t_conflict pnVar5;
  size_t mark_00;
  node_t_conflict pnVar6;
  undefined8 *puVar7;
  long lVar8;
  char *pcVar9;
  pos_t pVar10;
  node_t_conflict local_3c0;
  node_t_conflict local_3a8;
  mir_llong *local_398;
  arr_type *arr_type;
  char *local_258;
  undefined8 local_250;
  char *local_248;
  undefined8 local_240;
  char *local_238;
  undefined8 local_230;
  char *local_228;
  undefined8 local_220;
  char *local_218;
  undefined8 local_210;
  char *local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  node_t_conflict id;
  decl_t el_decl;
  undefined1 local_1b0 [16];
  anon_union_8_2_e4b0c9a5_for_u local_1a0;
  int local_194;
  ulong uStack_190;
  int first_p;
  mir_llong arr_size_val;
  type *curr_type;
  pos_t local_170;
  pos_t local_160;
  pos_t local_150;
  pos_t local_140;
  pos_t local_130;
  pos_t local_120;
  pos_t local_110;
  pos_t local_100;
  int local_ec;
  expr_conflict *peStack_e8;
  int addr_p;
  init_object_t init_object;
  symbol_t sym;
  size_t len;
  size_t mark;
  mir_llong size_val;
  mir_llong max_index;
  node_t_conflict temp;
  node_t_conflict size_node;
  node_t_conflict value;
  node_t_conflict str;
  node_t_conflict init;
  node_t_conflict curr_des;
  node_t_conflict des_list;
  node_t_conflict literal;
  expr_conflict *cexpr;
  type *type;
  int top_p_local;
  int const_only_p_local;
  node_t_conflict initializer_local;
  type **type_ptr_local;
  decl_t member_decl_local;
  c2m_ctx_t c2m_ctx_local;
  
  cexpr = (expr_conflict *)*type_ptr;
  mark = 0;
  local_ec = 0;
  type._0_4_ = top_p;
  type._4_4_ = const_only_p;
  _top_p_local = initializer;
  initializer_local = (node_t_conflict)type_ptr;
  type_ptr_local = (type **)member_decl;
  member_decl_local = (decl_t)c2m_ctx;
  des_list = get_compound_literal(initializer,&local_ec);
  if ((((des_list != (node_t_conflict)0x0) && (local_ec == 0)) && (_top_p_local->code != N_STR)) &&
     ((_top_p_local->code != N_STR16 && (_top_p_local->code != N_STR32)))) {
    literal = (node_t_conflict)_top_p_local->attr;
    check_assignment_types
              ((c2m_ctx_t)member_decl_local,(type *)cexpr,(type *)0x0,(expr_conflict *)literal,
               _top_p_local);
    _top_p_local = DLIST_node_t_el(&(des_list->u).ops,1);
  }
  while( true ) {
    if ((_top_p_local->code != N_LIST) &&
       ((*(int *)&cexpr->type != 6 ||
        (iVar4 = init_compatible_string_p(_top_p_local,*(type **)((cexpr->c).i_val + 8)), iVar4 == 0
        )))) {
      literal = (node_t_conflict)_top_p_local->attr;
      if ((((undefined1  [64])((undefined1  [64])*(expr_conflict *)literal & (undefined1  [64])0x1)
            == (undefined1  [64])0x0) &&
          (((_top_p_local->code != N_STR && (_top_p_local->code != N_STR16)) &&
           (_top_p_local->code != N_STR32)))) && (type._4_4_ != 0)) {
        setup_const_addr_p((c2m_ctx_t)member_decl_local,_top_p_local);
        pdVar3 = member_decl_local;
        literal = (node_t_conflict)_top_p_local->attr;
        if (((*(byte *)literal >> 1 & 1) == 0) &&
           ((des_list == (node_t_conflict)0x0 || (local_ec == 0)))) {
          local_100 = get_node_pos((c2m_ctx_t)member_decl_local,_top_p_local);
          error((c2m_ctx_t)pdVar3,0x1d58c5,local_100.fname,local_100._8_8_);
          return;
        }
        check_assignment_types
                  ((c2m_ctx_t)member_decl_local,(type *)cexpr,(type *)0x0,(expr_conflict *)literal,
                   _top_p_local);
        return;
      }
      check_assignment_types
                ((c2m_ctx_t)member_decl_local,(type *)cexpr,(type *)0x0,(expr_conflict *)literal,
                 _top_p_local);
      return;
    }
    str = DLIST_node_t_head(&(_top_p_local->u).ops);
    value = _top_p_local;
    if (((((_top_p_local->code == N_STR) || (_top_p_local->code == N_STR16)) ||
         (_top_p_local->code == N_STR32)) ||
        ((((((str != (node_t_conflict)0x0 && (str->code == N_INIT)) &&
            (pnVar5 = DLIST_node_t_el(&(_top_p_local->u).ops,1), pnVar5 == (node_t_conflict)0x0)) &&
           ((curr_des = DLIST_node_t_head(&(str->u).ops), curr_des->code == N_LIST &&
            (pnVar5 = DLIST_node_t_head(&(curr_des->u).ops), pnVar5 == (node_t_conflict)0x0)))) &&
          (pnVar5 = DLIST_node_t_el(&(str->u).ops,1), pnVar5 != (node_t_conflict)0x0)) &&
         (((value = DLIST_node_t_el(&(str->u).ops,1), value->code == N_STR ||
           (value->code == N_STR16)) || (value->code == N_STR32)))))) &&
       ((*(int *)&cexpr->type == 6 &&
        (iVar4 = init_compatible_string_p(value,*(type **)((cexpr->c).i_val + 8)), iVar4 != 0)))) {
      uVar1 = (value->u).s.len;
      iVar4 = incomplete_type_p((c2m_ctx_t)member_decl_local,(type *)cexpr);
      pdVar3 = member_decl_local;
      if (iVar4 == 0) {
        if (uVar1 <= *(long *)(*(long *)(*(long *)((cexpr->c).i_val + 0x18) + 8) + 0x30) + 1U) {
          return;
        }
        local_120 = get_node_pos((c2m_ctx_t)member_decl_local,_top_p_local);
        error((c2m_ctx_t)pdVar3,0x1d597d,local_120.fname,local_120._8_8_);
        return;
      }
      if (uVar1 < 0x7fffffff) {
        local_110 = get_node_pos((c2m_ctx_t)member_decl_local,
                                 *(node_t_conflict *)((cexpr->c).i_val + 0x18));
        pnVar5 = new_i_node((c2m_ctx_t)pdVar3,uVar1,local_110);
        *(node_t_conflict *)((cexpr->c).i_val + 0x18) = pnVar5;
        check((c2m_ctx_t)member_decl_local,*(node_t_conflict *)((cexpr->c).i_val + 0x18),
              (node_t_conflict)0x0);
        make_type_complete((c2m_ctx_t)member_decl_local,(type *)cexpr);
        return;
      }
      __assert_fail("len < MIR_INT_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e1c,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (str == (node_t_conflict)0x0) {
      iVar4 = scalar_type_p((type *)cexpr);
      pdVar3 = member_decl_local;
      if (iVar4 == 0) {
        return;
      }
      local_130 = get_node_pos((c2m_ctx_t)member_decl_local,_top_p_local);
      error((c2m_ctx_t)pdVar3,0x1d59a6,local_130.fname,local_130._8_8_);
      return;
    }
    if (str->code != N_INIT) {
      __assert_fail("init->code == N_INIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e29,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    curr_des = DLIST_node_t_head(&(str->u).ops);
    if (curr_des->code != N_LIST) {
      __assert_fail("des_list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e2b,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (((*(int *)&cexpr->type == 6) || (*(int *)&cexpr->type == 4)) || (*(int *)&cexpr->type == 5))
    break;
    max_index = (mir_llong)DLIST_node_t_next(str);
    pdVar3 = member_decl_local;
    if ((node_t_conflict)max_index != (node_t_conflict)0x0) {
      local_140 = get_node_pos((c2m_ctx_t)member_decl_local,(node_t_conflict)max_index);
      error((c2m_ctx_t)pdVar3,0x1d59ed,local_140.fname,local_140._8_8_);
      return;
    }
    max_index = (mir_llong)DLIST_node_t_head(&(curr_des->u).ops);
    pdVar3 = member_decl_local;
    if ((node_t_conflict)max_index != (node_t_conflict)0x0) {
      local_150 = get_node_pos((c2m_ctx_t)member_decl_local,(node_t_conflict)max_index);
      error((c2m_ctx_t)pdVar3,0x1d5a13,local_150.fname,local_150._8_8_);
      return;
    }
    _top_p_local = DLIST_node_t_next(curr_des);
    pdVar3 = member_decl_local;
    if ((int)type == 0) {
      local_160 = get_node_pos((c2m_ctx_t)member_decl_local,str);
      error((c2m_ctx_t)pdVar3,0x1d5a34,local_160.fname,local_160._8_8_);
      return;
    }
    type._0_4_ = 0;
  }
  mark_00 = VARR_init_object_tlength(*(VARR_init_object_t **)&member_decl_local[4].decl_spec);
  peStack_e8 = cexpr;
  init_object.container_type = (type *)((ulong)init_object.container_type._4_4_ << 0x20);
  if (*(int *)&cexpr->type == 6) {
    mark = get_arr_type_size((type *)cexpr);
    init_object.field_designator_p = -1;
    init_object._12_4_ = 0xffffffff;
  }
  else {
    init_object.field_designator_p = 0;
    init_object._12_4_ = 0;
  }
  obj._8_8_ = init_object.container_type;
  obj.container_type = (type *)peStack_e8;
  obj.u = (anon_union_8_2_e4b0c9a5_for_u)init_object._8_8_;
  VARR_init_object_tpush(*(VARR_init_object_t **)&member_decl_local[4].decl_spec,obj);
  size_val = -1;
  do {
    if (str == (node_t_conflict)0x0) {
LAB_00189e66:
      if (((*(int *)&cexpr->type == 6) && ((long)mark < 0)) && (-1 < size_val)) {
        puVar7 = (undefined8 *)reg_malloc((c2m_ctx_t)member_decl_local,0x20);
        cexpr = (expr_conflict *)create_type((c2m_ctx_t)member_decl_local,(type *)cexpr);
        iVar4 = incomplete_type_p((c2m_ctx_t)member_decl_local,(type *)cexpr);
        pdVar3 = member_decl_local;
        if (iVar4 == 0) {
          __assert_fail("incomplete_type_p (c2m_ctx, type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x1e9a,
                        "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        puVar2 = (undefined8 *)(cexpr->c).i_val;
        *puVar7 = *puVar2;
        puVar7[1] = puVar2[1];
        puVar7[2] = puVar2[2];
        puVar7[3] = puVar2[3];
        *(undefined8 **)&cexpr->c = puVar7;
        temp = *(node_t_conflict *)((cexpr->c).i_val + 0x18);
        if (size_val < 0x7fffffff) {
          lVar8 = size_val + 1;
          pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,temp);
          local_3a8 = new_i_node((c2m_ctx_t)pdVar3,lVar8,pVar10);
        }
        else {
          if (size_val < 0x7fffffffffffffff) {
            lVar8 = size_val + 1;
            pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,temp);
            local_3c0 = new_l_node((c2m_ctx_t)pdVar3,lVar8,pVar10);
          }
          else {
            lVar8 = size_val + 1;
            pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,temp);
            local_3c0 = new_ll_node((c2m_ctx_t)pdVar3,lVar8,pVar10);
          }
          local_3a8 = local_3c0;
        }
        *(node_t_conflict *)((cexpr->c).i_val + 0x18) = local_3a8;
        check((c2m_ctx_t)member_decl_local,*(node_t_conflict *)((cexpr->c).i_val + 0x18),
              (node_t_conflict)0x0);
        make_type_complete((c2m_ctx_t)member_decl_local,(type *)cexpr);
      }
      VARR_init_object_ttrunc(*(VARR_init_object_t **)&member_decl_local[4].decl_spec,mark_00);
      *(expr_conflict **)initializer_local = cexpr;
      return;
    }
    if (str->code != N_INIT) {
      __assert_fail("init->code == N_INIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e49,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    curr_des = DLIST_node_t_head(&(str->u).ops);
    size_node = DLIST_node_t_next(curr_des);
    pdVar3 = member_decl_local;
    if (((size_node->code == N_LIST) || (size_node->code == N_COMPOUND_LITERAL)) &&
       ((*(int *)&cexpr->type != 6 && ((*(int *)&cexpr->type != 4 && (*(int *)&cexpr->type != 5)))))
       ) {
      local_170 = get_node_pos((c2m_ctx_t)member_decl_local,str);
      pcVar9 = "compound literal for scalar initializer";
      if (size_node->code == N_LIST) {
        pcVar9 = "braces around scalar initializer";
      }
      error((c2m_ctx_t)pdVar3,pcVar9,local_170.fname,local_170._8_8_);
      goto LAB_00189e66;
    }
    init = DLIST_node_t_head(&(curr_des->u).ops);
    pdVar3 = member_decl_local;
    iVar4 = type._4_4_;
    pnVar5 = size_node;
    if (init == (node_t_conflict)0x0) {
      _curr_type = get_node_pos((c2m_ctx_t)member_decl_local,str);
      iVar4 = update_path_and_do((c2m_ctx_t)pdVar3,1,check_initializer,mark_00,pnVar5,iVar4,
                                 &size_val,_curr_type,"array/struct/union");
      if (iVar4 == 0) goto LAB_00189e66;
    }
    else {
      arr_size_val = (mir_llong)cexpr;
      local_194 = 1;
      VARR_init_object_ttrunc(*(VARR_init_object_t **)&member_decl_local[4].decl_spec,mark_00 + 1);
      while (init != (node_t_conflict)0x0) {
        VARR_init_object_tlast
                  ((init_object_t *)local_1b0,
                   *(VARR_init_object_t **)&member_decl_local[4].decl_spec);
        peStack_e8 = (expr_conflict *)local_1b0._0_8_;
        init_object.container_type = (type *)local_1b0._8_8_;
        init_object._8_8_ = local_1a0;
        if (local_194 == 0) {
          if (*(int *)(local_1b0._0_8_ + 0x18) == 6) {
            arr_size_val = *(mir_llong *)
                            (((anon_union_16_3_d88cf5f2_for_c *)(local_1b0._0_8_ + 0x30))->i_val + 8
                            );
          }
          else {
            if ((*(int *)(local_1b0._0_8_ + 0x18) != 4) && (*(int *)(local_1b0._0_8_ + 0x18) != 5))
            {
              __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x1e66,
                            "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                           );
            }
            arr_size_val = *(mir_llong *)((long)(local_1a0.curr_member)->attr + 0x40);
          }
        }
        else {
          VARR_init_object_tpop
                    ((init_object_t *)&el_decl,
                     *(VARR_init_object_t **)&member_decl_local[4].decl_spec);
        }
        pdVar3 = member_decl_local;
        if (init->code == N_FIELD_ID) {
          pnVar5 = DLIST_node_t_head(&(init->u).ops);
          pdVar3 = member_decl_local;
          if ((*(int *)(arr_size_val + 0x18) == 4) || (*(int *)(arr_size_val + 0x18) == 5)) {
            iVar4 = symbol_find((c2m_ctx_t)member_decl_local,S_REGULAR,pnVar5,
                                *(node_t_conflict *)(arr_size_val + 0x30),(symbol_t *)&init_object.u
                               );
            pdVar3 = member_decl_local;
            if (iVar4 == 0) {
              pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,init);
              local_1f8 = pVar10.fname;
              local_1f0 = pVar10._8_8_;
              error((c2m_ctx_t)pdVar3,0x1d5b1c,local_1f8,local_1f0,(pnVar5->u).s.s);
            }
            else {
              process_init_field_designator
                        ((c2m_ctx_t)member_decl_local,sym.scope,(type *)arr_size_val);
              pdVar3 = member_decl_local;
              pnVar6 = DLIST_node_t_next(init);
              iVar4 = type._4_4_;
              pnVar5 = size_node;
              pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,str);
              iVar4 = update_path_and_do((c2m_ctx_t)pdVar3,(uint)(pnVar6 == (node_t_conflict)0x0),
                                         check_initializer,mark_00,pnVar5,iVar4,(mir_llong *)0x0,
                                         pVar10,"struct/union");
joined_r0x00189e22:
              if (iVar4 == 0) break;
            }
          }
          else {
            pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,init);
            local_1e8 = pVar10.fname;
            local_1e0 = pVar10._8_8_;
            error((c2m_ctx_t)pdVar3,0x1d5aee,local_1e8,local_1e0);
          }
        }
        else if (*(int *)(arr_size_val + 0x18) == 6) {
          literal = (node_t_conflict)init->attr;
          if ((literal->code & N_I) == N_IGNORE) {
            pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,init);
            local_228 = pVar10.fname;
            local_220 = pVar10._8_8_;
            error((c2m_ctx_t)pdVar3,0x1d5b65,local_228,local_220);
          }
          else {
            iVar4 = integer_type_p((type *)(literal->op_link).next);
            pdVar3 = member_decl_local;
            if (iVar4 == 0) {
              pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,init);
              local_238 = pVar10.fname;
              local_230 = pVar10._8_8_;
              error((c2m_ctx_t)pdVar3,0x1d5b8c,local_238,local_230);
            }
            else {
              iVar4 = incomplete_type_p((c2m_ctx_t)member_decl_local,(type *)arr_size_val);
              if (((iVar4 == 0) ||
                  (iVar4 = signed_integer_type_p((type *)(literal->op_link).next),
                  pdVar3 = member_decl_local, iVar4 == 0)) ||
                 (lVar8._0_4_ = literal[1].code, lVar8._4_4_ = literal[1].uid, -1 < lVar8)) {
                uStack_190 = get_arr_type_size((type *)arr_size_val);
                pdVar3 = member_decl_local;
                if (((long)uStack_190 < 0) ||
                   (uVar1._0_4_ = literal[1].code, uVar1._4_4_ = literal[1].uid, uVar1 < uStack_190)
                   ) {
                  init_object._8_8_ = *(long *)(literal + 1) + -1;
                  init_object.container_type =
                       (type *)((ulong)init_object.container_type & 0xffffffff00000000);
                  peStack_e8 = (expr_conflict *)arr_size_val;
                  obj_00._8_8_ = init_object.container_type;
                  obj_00.container_type = (type *)arr_size_val;
                  obj_00.u.curr_member = (node_t_conflict)init_object._8_8_;
                  VARR_init_object_tpush
                            (*(VARR_init_object_t **)&member_decl_local[4].decl_spec,obj_00);
                  pdVar3 = member_decl_local;
                  pnVar6 = DLIST_node_t_next(init);
                  iVar4 = type._4_4_;
                  pnVar5 = size_node;
                  if (local_194 == 0) {
                    local_398 = (mir_llong *)0x0;
                  }
                  else {
                    local_398 = &size_val;
                  }
                  pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,str);
                  iVar4 = update_path_and_do((c2m_ctx_t)pdVar3,
                                             (uint)(pnVar6 == (node_t_conflict)0x0),
                                             check_initializer,mark_00,pnVar5,iVar4,local_398,pVar10
                                             ,"array");
                  goto joined_r0x00189e22;
                }
                pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,init);
                local_258 = pVar10.fname;
                local_250 = pVar10._8_8_;
                error((c2m_ctx_t)pdVar3,0x1d5bf6,local_258,local_250);
              }
              else {
                pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,init);
                local_248 = pVar10.fname;
                local_240 = pVar10._8_8_;
                error((c2m_ctx_t)pdVar3,0x1d5bbb,local_248,local_240);
              }
            }
          }
        }
        else {
          pVar10 = get_node_pos((c2m_ctx_t)member_decl_local,init);
          local_218 = pVar10.fname;
          local_210 = pVar10._8_8_;
          error((c2m_ctx_t)pdVar3,0x1d5b3c,local_218,local_210);
        }
        init = DLIST_node_t_next(init);
        local_194 = 0;
      }
    }
    str = DLIST_node_t_next(str);
  } while( true );
}

Assistant:

static void check_initializer (c2m_ctx_t c2m_ctx, decl_t member_decl MIR_UNUSED,
                               struct type **type_ptr, node_t initializer, int const_only_p,
                               int top_p) {
  struct type *type = *type_ptr;
  struct expr *cexpr;
  node_t literal, des_list, curr_des, init, str, value, size_node, temp;
  mir_llong max_index;
  mir_llong size_val = 0; /* to remove an uninitialized warning */
  size_t mark, len;
  symbol_t sym;
  init_object_t init_object;
  int addr_p = FALSE; /* to remove an uninitialized warning */

  literal = get_compound_literal (initializer, &addr_p);
  if (literal != NULL && !addr_p && initializer->code != N_STR && initializer->code != N_STR16
      && initializer->code != N_STR32) {
    cexpr = initializer->attr;
    check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
    initializer = NL_EL (literal->u.ops, 1);
  }
check_one_value:
  if (initializer->code != N_LIST
      && !(type->mode == TM_ARR
           && init_compatible_string_p (initializer, type->u.arr_type->el_type))) {
    if ((cexpr = initializer->attr)->const_p || initializer->code == N_STR
        || initializer->code == N_STR16 || initializer->code == N_STR32 || !const_only_p) {
      check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
    } else {
      setup_const_addr_p (c2m_ctx, initializer);
      if ((cexpr = initializer->attr)->const_addr_p || (literal != NULL && addr_p))
        check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
      else
        error (c2m_ctx, POS (initializer),
               "initializer of non-auto or thread local object"
               " should be a constant expression or address");
    }
    return;
  }
  init = NL_HEAD (initializer->u.ops);
  if (((str = initializer)->code == N_STR || str->code == N_STR16
       || str->code == N_STR32 /* string or string in parentheses */
       || (init != NULL && init->code == N_INIT && NL_EL (initializer->u.ops, 1) == NULL
           && (des_list = NL_HEAD (init->u.ops))->code == N_LIST
           && NL_HEAD (des_list->u.ops) == NULL && NL_EL (init->u.ops, 1) != NULL
           && ((str = NL_EL (init->u.ops, 1))->code == N_STR || str->code == N_STR16
               || str->code == N_STR32)))
      && type->mode == TM_ARR && init_compatible_string_p (str, type->u.arr_type->el_type)) {
    len = str->u.s.len;
    if (incomplete_type_p (c2m_ctx, type)) {
      assert (len < MIR_INT_MAX);
      type->u.arr_type->size = new_i_node (c2m_ctx, (long) len, POS (type->u.arr_type->size));
      check (c2m_ctx, type->u.arr_type->size, NULL);
      make_type_complete (c2m_ctx, type);
    } else if (len > (size_t) ((struct expr *) type->u.arr_type->size->attr)->c.i_val + 1) {
      error (c2m_ctx, POS (initializer), "string is too long for array initializer");
    }
    return;
  }
  if (init == NULL) {
    if (scalar_type_p (type)) error (c2m_ctx, POS (initializer), "empty scalar initializer");
    return;
  }
  assert (init->code == N_INIT);
  des_list = NL_HEAD (init->u.ops);
  assert (des_list->code == N_LIST);
  if (type->mode != TM_ARR && type->mode != TM_STRUCT && type->mode != TM_UNION) {
    if ((temp = NL_NEXT (init)) != NULL) {
      error (c2m_ctx, POS (temp), "excess elements in scalar initializer");
      return;
    }
    if ((temp = NL_HEAD (des_list->u.ops)) != NULL) {
      error (c2m_ctx, POS (temp), "designator in scalar initializer");
      return;
    }
    initializer = NL_NEXT (des_list);
    if (!top_p) {
      error (c2m_ctx, POS (init), "braces around scalar initializer");
      return;
    }
    top_p = FALSE;
    goto check_one_value;
  }
  mark = VARR_LENGTH (init_object_t, init_object_path);
  init_object.container_type = type;
  init_object.field_designator_p = FALSE;
  if (type->mode == TM_ARR) {
    size_val = get_arr_type_size (type);
    init_object.u.curr_index = -1;
  } else {
    init_object.u.curr_member = NULL;
  }
  VARR_PUSH (init_object_t, init_object_path, init_object);
  max_index = -1;
  for (; init != NULL; init = NL_NEXT (init)) {
    assert (init->code == N_INIT);
    des_list = NL_HEAD (init->u.ops);
    value = NL_NEXT (des_list);
    if ((value->code == N_LIST || value->code == N_COMPOUND_LITERAL) && type->mode != TM_ARR
        && type->mode != TM_STRUCT && type->mode != TM_UNION) {
      error (c2m_ctx, POS (init),
             value->code == N_LIST ? "braces around scalar initializer"
                                   : "compound literal for scalar initializer");
      break;
    }
    if ((curr_des = NL_HEAD (des_list->u.ops)) == NULL) {
      if (!update_path_and_do (c2m_ctx, TRUE, check_initializer, mark, value, const_only_p,
                               &max_index, POS (init), "array/struct/union"))
        break;
    } else {
      struct type *curr_type = type;
      mir_llong arr_size_val MIR_UNUSED;
      int first_p = TRUE;

      VARR_TRUNC (init_object_t, init_object_path, mark + 1);
      for (; curr_des != NULL; curr_des = NL_NEXT (curr_des), first_p = FALSE) {
        init_object = VARR_LAST (init_object_t, init_object_path);
        if (first_p) {
          VARR_POP (init_object_t, init_object_path);
        } else {
          if (init_object.container_type->mode == TM_ARR) {
            curr_type = init_object.container_type->u.arr_type->el_type;
          } else {
            assert (init_object.container_type->mode == TM_STRUCT
                    || init_object.container_type->mode == TM_UNION);
            decl_t el_decl = init_object.u.curr_member->attr;
            curr_type = el_decl->decl_spec.type;
          }
        }
        if (curr_des->code == N_FIELD_ID) {
          node_t id = NL_HEAD (curr_des->u.ops);

          if (curr_type->mode != TM_STRUCT && curr_type->mode != TM_UNION) {
            error (c2m_ctx, POS (curr_des), "field name not in struct or union initializer");
          } else if (!symbol_find (c2m_ctx, S_REGULAR, id, curr_type->u.tag_type, &sym)) {
            error (c2m_ctx, POS (curr_des), "unknown field %s in initializer", id->u.s.s);
          } else {
            process_init_field_designator (c2m_ctx, sym.def_node, curr_type);
            if (!update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, check_initializer, mark,
                                     value, const_only_p, NULL, POS (init), "struct/union"))
              break;
          }
        } else if (curr_type->mode != TM_ARR) {
          error (c2m_ctx, POS (curr_des), "array index in initializer for non-array");
        } else if (!(cexpr = curr_des->attr)->const_p) {
          error (c2m_ctx, POS (curr_des), "nonconstant array index in initializer");
        } else if (!integer_type_p (cexpr->type)) {
          error (c2m_ctx, POS (curr_des), "array index in initializer not of integer type");
        } else if (incomplete_type_p (c2m_ctx, curr_type) && signed_integer_type_p (cexpr->type)
                   && cexpr->c.i_val < 0) {
          error (c2m_ctx, POS (curr_des),
                 "negative array index in initializer for array without size");
        } else if ((arr_size_val = get_arr_type_size (curr_type)) >= 0
                   && (mir_ullong) arr_size_val <= cexpr->c.u_val) {
          error (c2m_ctx, POS (curr_des), "array index in initializer exceeds array bounds");
        } else {
          init_object.u.curr_index = cexpr->c.i_val - 1; /* previous el */
          init_object.field_designator_p = FALSE;
          init_object.container_type = curr_type;
          VARR_PUSH (init_object_t, init_object_path, init_object);
          if (!update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, check_initializer, mark,
                                   value, const_only_p, first_p ? &max_index : NULL, POS (init),
                                   "array"))
            break;
        }
      }
    }
  }
  if (type->mode == TM_ARR && size_val < 0 && max_index >= 0) {
    /* Array w/o size: define it.  Copy the type as the incomplete
       type can be shared by declarations with different length
       initializers.  We need only one level of copying as sub-array
       can not have incomplete type with an initializer. */
    struct arr_type *arr_type = reg_malloc (c2m_ctx, sizeof (struct arr_type));

    type = create_type (c2m_ctx, type);
    assert (incomplete_type_p (c2m_ctx, type));
    *arr_type = *type->u.arr_type;
    type->u.arr_type = arr_type;
    size_node = type->u.arr_type->size;
    type->u.arr_type->size
      = (max_index < MIR_INT_MAX    ? new_i_node (c2m_ctx, (long) max_index + 1, POS (size_node))
         : max_index < MIR_LONG_MAX ? new_l_node (c2m_ctx, (long) max_index + 1, POS (size_node))
                                    : new_ll_node (c2m_ctx, max_index + 1, POS (size_node)));
    check (c2m_ctx, type->u.arr_type->size, NULL);
    make_type_complete (c2m_ctx, type);
  }
  VARR_TRUNC (init_object_t, init_object_path, mark);
  *type_ptr = type;
  return;
}